

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O2

ShaderCodeBufferDesc * __thiscall
Diligent::SPIRVShaderResources::GetUniformBufferDesc(SPIRVShaderResources *this,Uint32 Index)

{
  void *pvVar1;
  char (*in_R8) [19];
  string msg;
  Uint32 local_2c;
  string local_28;
  
  local_2c = Index;
  if (Index < this->m_StorageBufferOffset) {
    pvVar1 = (this->m_UBReflectionBuffer)._M_t.
             super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
             _M_t.
             super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
             .super__Head_base<0UL,_void_*,_false>._M_head_impl;
    if (pvVar1 != (void *)0x0) {
      return (ShaderCodeBufferDesc *)((long)pvVar1 + (ulong)Index * 0x10);
    }
    FormatString<char[128]>
              (&local_28,
               (char (*) [128])
               "Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader."
              );
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetUniformBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0xd3);
  }
  else {
    FormatString<char[23],unsigned_int,char[19]>
              (&local_28,(Diligent *)"Uniform buffer index (",(char (*) [23])&local_2c,
               (uint *)") is out of range.",in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetUniformBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0xcd);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return (ShaderCodeBufferDesc *)0x0;
}

Assistant:

const ShaderCodeBufferDesc* GetUniformBufferDesc(Uint32 Index) const
    {
        if (Index >= GetNumUBs())
        {
            UNEXPECTED("Uniform buffer index (", Index, ") is out of range.");
            return nullptr;
        }

        if (!m_UBReflectionBuffer)
        {
            UNEXPECTED("Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader.");
            return nullptr;
        }

        return reinterpret_cast<const ShaderCodeBufferDesc*>(m_UBReflectionBuffer.get()) + Index;
    }